

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  uint value;
  
  pbVar3 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
  }
  pbVar3 = ctxt->cur;
  bVar1 = *pbVar3;
  value = 3;
  if (bVar1 == 0x2d) {
    iVar2 = 0;
LAB_001c5649:
    do {
      iVar4 = iVar2;
      pbVar3 = pbVar3 + 1;
      ctxt->cur = pbVar3;
      if ((ulong)*pbVar3 < 0x21) {
        iVar2 = iVar4;
        if ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0) goto LAB_001c5649;
      }
      iVar2 = 1 - iVar4;
    } while (*pbVar3 == 0x2d);
    value = iVar4 == 1 | 2;
  }
  xmlXPathCompPathExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar3 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    }
    while (*ctxt->cur == '|') {
      iVar2 = ctxt->comp->last;
      xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      pbVar3 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      }
      xmlXPathCompPathExpr(ctxt);
      xmlXPathCompExprAdd(ctxt,iVar2,ctxt->comp->last,XPATH_OP_UNION,0,0,0,(void *)0x0,(void *)0x0);
      pbVar3 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      }
    }
  }
  if ((bVar1 == 0x2d) && (ctxt->error == 0)) {
    xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_PLUS,value,0,0,(void *)0x0,(void *)0x0);
  }
  return;
}

Assistant:

static void
xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt) {
    int minus = 0;
    int found = 0;

    SKIP_BLANKS;
    while (CUR == '-') {
        minus = 1 - minus;
	found = 1;
	NEXT;
	SKIP_BLANKS;
    }

    xmlXPathCompUnionExpr(ctxt);
    CHECK_ERROR;
    if (found) {
	if (minus)
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 2, 0);
	else
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 3, 0);
    }
}